

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool is_indirect_object(string *v,int *obj,int *gen)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string local_70 [8];
  string g_str;
  string o_str;
  char *p;
  int *gen_local;
  int *obj_local;
  string *v_local;
  
  o_str.field_2._8_8_ = std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)(g_str.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_70);
  bVar1 = qpdf::util::is_digit(*(char *)o_str.field_2._8_8_);
  if (bVar1) {
    while (bVar1 = qpdf::util::is_digit(*(char *)o_str.field_2._8_8_), bVar1) {
      o_str.field_2._8_8_ = o_str.field_2._8_8_ + 1;
      std::__cxx11::string::append((ulong)((long)&g_str.field_2 + 8),'\x01');
    }
    if (*(char *)o_str.field_2._8_8_ == ' ') {
      for (; *(char *)o_str.field_2._8_8_ == ' '; o_str.field_2._8_8_ = o_str.field_2._8_8_ + 1) {
      }
      bVar1 = qpdf::util::is_digit(*(char *)o_str.field_2._8_8_);
      if (bVar1) {
        while (bVar1 = qpdf::util::is_digit(*(char *)o_str.field_2._8_8_), bVar1) {
          o_str.field_2._8_8_ = o_str.field_2._8_8_ + 1;
          std::__cxx11::string::append((ulong)local_70,'\x01');
        }
        if (*(char *)o_str.field_2._8_8_ == ' ') {
          for (; *(char *)o_str.field_2._8_8_ == ' '; o_str.field_2._8_8_ = o_str.field_2._8_8_ + 1)
          {
          }
          if (*(char *)o_str.field_2._8_8_ == 'R') {
            if (*(char *)(o_str.field_2._8_8_ + 1) == '\0') {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = QUtil::string_to_int(pcVar3);
              *obj = iVar2;
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = QUtil::string_to_int(pcVar3);
              *gen = iVar2;
              v_local._7_1_ = 0 < *obj;
            }
            else {
              v_local._7_1_ = false;
            }
          }
          else {
            v_local._7_1_ = false;
          }
        }
        else {
          v_local._7_1_ = false;
        }
      }
      else {
        v_local._7_1_ = false;
      }
    }
    else {
      v_local._7_1_ = false;
    }
  }
  else {
    v_local._7_1_ = false;
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(g_str.field_2._M_local_buf + 8));
  return v_local._7_1_;
}

Assistant:

static bool
is_indirect_object(std::string const& v, int& obj, int& gen)
{
    char const* p = v.c_str();
    std::string o_str;
    std::string g_str;
    if (!util::is_digit(*p)) {
        return false;
    }
    while (util::is_digit(*p)) {
        o_str.append(1, *p++);
    }
    if (*p != ' ') {
        return false;
    }
    while (*p == ' ') {
        ++p;
    }
    if (!util::is_digit(*p)) {
        return false;
    }
    while (util::is_digit(*p)) {
        g_str.append(1, *p++);
    }
    if (*p != ' ') {
        return false;
    }
    while (*p == ' ') {
        ++p;
    }
    if (*p++ != 'R') {
        return false;
    }
    if (*p) {
        return false;
    }
    obj = QUtil::string_to_int(o_str.c_str());
    gen = QUtil::string_to_int(g_str.c_str());
    return obj > 0;
}